

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_text_wrap_colored(nk_context *ctx,char *str,int len,nk_color color)

{
  nk_vec2 nVar1;
  nk_window *pnVar2;
  nk_user_font *font;
  int len_00;
  int iVar3;
  float fVar4;
  float fVar5;
  nk_rect b;
  int local_b0;
  float width;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  nk_rect local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  nk_rect bounds;
  nk_text local_40;
  
  if (((ctx != (nk_context *)0x0) && (pnVar2 = ctx->current, pnVar2 != (nk_window *)0x0)) &&
     (pnVar2->layout != (nk_panel *)0x0)) {
    nk_panel_alloc_space(&bounds,ctx);
    local_40.background = (ctx->style).window.background;
    font = (ctx->style).font;
    local_98.x = bounds.x;
    local_98.y = bounds.y;
    local_98.w = 0.0;
    local_98.h = 0.0;
    local_40.padding.x = 0.0;
    local_40.padding.y = 0.0;
    nVar1 = (ctx->style).text.padding;
    fVar4 = nVar1.x;
    fStack_84 = nVar1.y;
    local_78 = fVar4 + fVar4;
    if (fVar4 + fVar4 <= bounds.w) {
      local_78 = bounds.w;
    }
    fVar5 = fStack_84 + fStack_84;
    local_88 = fVar5;
    if (fVar5 <= bounds.h) {
      local_88 = bounds.h;
    }
    local_88 = local_88 - fVar5;
    local_a8 = fVar4 + bounds.x;
    fStack_a4 = fStack_84 + bounds.y;
    uStack_a0 = 0;
    local_78 = fVar4 * -2.0 + local_78;
    fStack_74 = fStack_84 * 2.0 + font->height;
    fStack_70 = fStack_84 + 0.0;
    uStack_6c = 0;
    fStack_80 = fStack_84;
    fStack_7c = fStack_84;
    local_68 = fStack_84;
    fStack_64 = fStack_84;
    fStack_60 = fStack_84;
    fStack_5c = fStack_84;
    local_40.text = color;
    len_00 = nk_text_clamp(font,str,len,local_78,&local_b0,&width,&nk_widget_text_wrap_seperator,1);
    local_98.x = local_98.y + local_88;
    local_98.h = local_98.y;
    local_98.w = local_98.y;
    iVar3 = 0;
    while (((iVar3 < len && (len_00 != 0)) && (fStack_74 + fStack_a4 < local_98.x))) {
      b.h = fStack_74;
      b.w = local_78;
      b.y = fStack_a4;
      b.x = local_a8;
      local_88 = fStack_a4;
      fStack_84 = fStack_a4;
      fStack_80 = fStack_a4;
      fStack_7c = fStack_a4;
      nk_widget_text(&pnVar2->buffer,b,str + iVar3,len_00,&local_40,0x11,font);
      iVar3 = iVar3 + len_00;
      fStack_a4 = local_68 + local_68 + font->height + local_88;
      len_00 = nk_text_clamp(font,str + iVar3,len - iVar3,local_78,&local_b0,&width,
                             &nk_widget_text_wrap_seperator,1);
    }
  }
  return;
}

Assistant:

NK_API void
nk_text_wrap_colored(struct nk_context *ctx, const char *str,
int len, struct nk_color color)
{
struct nk_window *win;
const struct nk_style *style;

struct nk_vec2 item_padding;
struct nk_rect bounds;
struct nk_text text;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return;

win = ctx->current;
style = &ctx->style;
nk_panel_alloc_space(&bounds, ctx);
item_padding = style->text.padding;

text.padding.x = item_padding.x;
text.padding.y = item_padding.y;
text.background = style->window.background;
text.text = color;
nk_widget_text_wrap(&win->buffer, bounds, str, len, &text, style->font);
}